

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PNativeStruct::PNativeStruct(PNativeStruct *this,FName *name)

{
  char *pcVar1;
  FName local_1c;
  FName *local_18;
  FName *name_local;
  PNativeStruct *this_local;
  
  local_18 = name;
  name_local = (FName *)this;
  FName::FName(&local_1c,name);
  PStruct::PStruct(&this->super_PStruct,&local_1c,(PTypeBase *)0x0);
  (this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
  super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_009f3ba0;
  pcVar1 = FName::GetChars(name);
  FString::Format(&(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                   mDescriptiveName,"NativeStruct<%s>",pcVar1);
  *(undefined4 *)
   &(this->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.super_PTypeBase.
    super_DObject.field_0x24 = 0;
  (this->super_PStruct).HasNativeFields = true;
  return;
}

Assistant:

PNativeStruct::PNativeStruct(FName name)
	: PStruct(name, nullptr)
{
	mDescriptiveName.Format("NativeStruct<%s>", name.GetChars());
	Size = 0;
	HasNativeFields = true;
}